

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_saveNodeTo(PyObject *self,PyObject *args)

{
  int iVar1;
  FILE *f;
  long lVar2;
  undefined8 uVar3;
  PyObject *pPVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int format;
  char *encoding;
  PyObject *pyobj_node;
  PyObject *py_file;
  undefined4 local_44;
  long local_40;
  undefined *local_38;
  PyObject *local_30;
  
  local_30 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"OOzi:serializeNode",&local_38,&local_30,&local_40,&local_44)
  ;
  if (iVar1 == 0) {
    return (PyObject *)0x0;
  }
  if (local_38 == &_Py_NoneStruct) {
    lVar6 = 0;
  }
  else {
    lVar6 = *(long *)(local_38 + 0x10);
  }
  lVar5 = -1;
  if (lVar6 == 0) goto LAB_0013daeb;
  if (local_30 == (PyObject *)&_Py_NoneStruct) {
    f = (FILE *)0x0;
  }
  else {
    f = libxml_PyFileGet(local_30);
  }
  if (f == (FILE *)0x0) goto LAB_0013daeb;
  lVar7 = lVar6;
  if ((*(uint *)(lVar6 + 8) | 4) != 0xd) {
    lVar7 = *(long *)(lVar6 + 0x40);
  }
  if ((*(int *)(lVar7 + 8) == 0xd) && (local_40 == 0)) {
    local_40 = htmlGetMetaEncoding(lVar7);
  }
  if (local_40 == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = xmlFindCharEncodingHandler();
    if (lVar2 == 0) {
      libxml_PyFileRelease(f);
      goto LAB_0013daeb;
    }
  }
  if (*(int *)(lVar7 + 8) == 0xd) {
    if (lVar2 == 0) {
      lVar2 = xmlFindCharEncodingHandler("HTML");
    }
    if (lVar2 == 0) {
      lVar2 = xmlFindCharEncodingHandler("ascii");
    }
  }
  uVar3 = xmlOutputBufferCreateFile(f,lVar2);
  if (*(int *)(lVar6 + 8) == 0xd) {
    htmlDocContentDumpFormatOutput(uVar3,lVar7,local_40,local_44);
LAB_0013dad6:
    iVar1 = xmlOutputBufferClose(uVar3);
  }
  else {
    if (*(int *)(lVar6 + 8) != 9) {
      if (*(int *)(lVar7 + 8) == 0xd) {
        htmlNodeDumpFormatOutput(uVar3,lVar7,lVar6,local_40,local_44);
      }
      else {
        xmlNodeDumpOutput(uVar3,lVar7,lVar6,0,local_44,local_40);
      }
      goto LAB_0013dad6;
    }
    iVar1 = xmlSaveFormatFileTo(uVar3,lVar7,local_40,local_44);
  }
  libxml_PyFileRelease(f);
  lVar5 = (long)iVar1;
LAB_0013daeb:
  pPVar4 = (PyObject *)PyLong_FromLong(lVar5);
  return pPVar4;
}

Assistant:

static PyObject *
libxml_saveNodeTo(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_file = NULL;
    FILE *output;
    PyObject *pyobj_node;
    xmlNodePtr node;
    xmlDocPtr doc;
    const char *encoding;
    int format;
    int len;
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;

    if (!PyArg_ParseTuple(args, (char *) "OOzi:serializeNode", &pyobj_node,
                          &py_file, &encoding, &format))
        return (NULL);
    node = (xmlNodePtr) PyxmlNode_Get(pyobj_node);
    if (node == NULL) {
        return (PyLong_FromLong((long) -1));
    }
    output = PyFile_Get(py_file);
    if (output == NULL) {
        return (PyLong_FromLong((long) -1));
    }

    if (node->type == XML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
    } else if (node->type == XML_HTML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
    } else {
        doc = node->doc;
    }
#ifdef LIBXML_HTML_ENABLED
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if (encoding == NULL)
            encoding = (const char *) htmlGetMetaEncoding(doc);
    }
#endif /* LIBXML_HTML_ENABLED */
    if (encoding != NULL) {
        handler = xmlFindCharEncodingHandler(encoding);
        if (handler == NULL) {
            PyFile_Release(output);
            return (PyLong_FromLong((long) -1));
        }
    }
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    buf = xmlOutputBufferCreateFile(output, handler);
    if (node->type == XML_DOCUMENT_NODE) {
        len = xmlSaveFormatFileTo(buf, doc, encoding, format);
#ifdef LIBXML_HTML_ENABLED
    } else if (node->type == XML_HTML_DOCUMENT_NODE) {
        htmlDocContentDumpFormatOutput(buf, doc, encoding, format);
        len = xmlOutputBufferClose(buf);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        htmlNodeDumpFormatOutput(buf, doc, node, encoding, format);
        len = xmlOutputBufferClose(buf);
#endif /* LIBXML_HTML_ENABLED */
    } else {
        xmlNodeDumpOutput(buf, doc, node, 0, format, encoding);
        len = xmlOutputBufferClose(buf);
    }
    PyFile_Release(output);
    return (PyLong_FromLong((long) len));
}